

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtSwapVars(word *pTruth,int nVars,int iVar,int jVar)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  word wVar6;
  word (*pawVar7) [3];
  byte bVar8;
  word t_1;
  int jStep_1;
  int j_1;
  int iStep;
  int i;
  word *pLimit_1;
  int shift_1;
  int jStep;
  int j;
  word *pLimit;
  word high2Low;
  word low2High;
  int local_30;
  int shift;
  int w;
  int nWords;
  word *s_PMasks;
  int t;
  int jVar_local;
  int iVar_local;
  int nVars_local;
  word *pTruth_local;
  
  if (iVar != jVar) {
    s_PMasks._4_4_ = jVar;
    t = iVar;
    if (jVar < iVar) {
      s_PMasks._4_4_ = iVar;
      t = jVar;
    }
    if ((s_PMasks._4_4_ <= t) || (nVars <= s_PMasks._4_4_)) {
      __assert_fail("iVar < jVar && jVar < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                    ,0x59b,"void Abc_TtSwapVars(word *, int, int, int)");
    }
    if (nVars < 7) {
      wVar6 = Abc_Tt6SwapVars(*pTruth,t,s_PMasks._4_4_);
      *pTruth = wVar6;
    }
    else if (s_PMasks._4_4_ < 6) {
      pawVar7 = s_PPMasks[t] + s_PMasks._4_4_;
      iVar3 = Abc_TtWordNum(nVars);
      bVar8 = (char)(1 << ((byte)s_PMasks._4_4_ & 0x1f)) - (char)(1 << ((byte)t & 0x1f));
      for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
        pTruth[local_30] =
             pTruth[local_30] & (*pawVar7)[0] | (pTruth[local_30] & (*pawVar7)[1]) << (bVar8 & 0x3f)
             | (pTruth[local_30] & (*pawVar7)[2]) >> (bVar8 & 0x3f);
      }
    }
    else {
      _iVar_local = pTruth;
      if ((t < 6) && (5 < s_PMasks._4_4_)) {
        iVar3 = Abc_TtWordNum(nVars);
        iVar4 = Abc_TtWordNum(s_PMasks._4_4_);
        for (; _iVar_local < pTruth + iVar3; _iVar_local = _iVar_local + (iVar4 << 1)) {
          for (shift_1 = 0; shift_1 < iVar4; shift_1 = shift_1 + 1) {
            uVar1 = _iVar_local[shift_1];
            uVar2 = s_Truths6[t];
            bVar8 = (byte)(1 << ((byte)t & 0x1f));
            _iVar_local[shift_1] =
                 _iVar_local[shift_1] & (s_Truths6[t] ^ 0xffffffffffffffff) |
                 _iVar_local[shift_1 + iVar4] << (bVar8 & 0x3f) & s_Truths6[t];
            _iVar_local[shift_1 + iVar4] =
                 _iVar_local[shift_1 + iVar4] & s_Truths6[t] | (uVar1 & uVar2) >> (bVar8 & 0x3f);
          }
        }
      }
      else {
        iVar3 = Abc_TtWordNum(nVars);
        iVar4 = Abc_TtWordNum(t);
        iVar5 = Abc_TtWordNum(s_PMasks._4_4_);
        for (; _iVar_local < pTruth + iVar3; _iVar_local = _iVar_local + (iVar5 << 1)) {
          for (j_1 = 0; j_1 < iVar5; j_1 = iVar4 * 2 + j_1) {
            for (t_1._4_4_ = 0; t_1._4_4_ < iVar4; t_1._4_4_ = t_1._4_4_ + 1) {
              wVar6 = _iVar_local[iVar4 + j_1 + t_1._4_4_];
              _iVar_local[iVar4 + j_1 + t_1._4_4_] = _iVar_local[iVar5 + j_1 + t_1._4_4_];
              _iVar_local[iVar5 + j_1 + t_1._4_4_] = wVar6;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtSwapVars( word * pTruth, int nVars, int iVar, int jVar )
{
    if ( iVar == jVar )
        return;
    if ( jVar < iVar )
        ABC_SWAP( int, iVar, jVar );
    assert( iVar < jVar && jVar < nVars );
    if ( nVars <= 6 )
    {
        pTruth[0] = Abc_Tt6SwapVars( pTruth[0], iVar, jVar );
        return;
    }
    if ( jVar <= 5 )
    {
        word * s_PMasks = s_PPMasks[iVar][jVar];
        int nWords = Abc_TtWordNum(nVars);
        int w, shift = (1 << jVar) - (1 << iVar);
        for ( w = 0; w < nWords; w++ )
            pTruth[w] = (pTruth[w] & s_PMasks[0]) | ((pTruth[w] & s_PMasks[1]) << shift) | ((pTruth[w] & s_PMasks[2]) >> shift);
        return;
    }
    if ( iVar <= 5 && jVar > 5 )
    {
        word low2High, high2Low;
        word * pLimit = pTruth + Abc_TtWordNum(nVars);
        int j, jStep = Abc_TtWordNum(jVar);
        int shift = 1 << iVar;
        for ( ; pTruth < pLimit; pTruth += 2*jStep )
            for ( j = 0; j < jStep; j++ )
            {
                low2High = (pTruth[j] & s_Truths6[iVar]) >> shift;
                high2Low = (pTruth[j+jStep] << shift) & s_Truths6[iVar];
                pTruth[j] = (pTruth[j] & ~s_Truths6[iVar]) | high2Low;
                pTruth[j+jStep] = (pTruth[j+jStep] & s_Truths6[iVar]) | low2High;
            }
        return;
    }
    {
        word * pLimit = pTruth + Abc_TtWordNum(nVars);
        int i, iStep = Abc_TtWordNum(iVar);
        int j, jStep = Abc_TtWordNum(jVar);
        for ( ; pTruth < pLimit; pTruth += 2*jStep )
            for ( i = 0; i < jStep; i += 2*iStep )
                for ( j = 0; j < iStep; j++ )
                    ABC_SWAP( word, pTruth[iStep + i + j], pTruth[jStep + i + j] );
        return;
    }    
}